

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O1

void __thiscall
sglr::Context::texImage2D
          (Context *this,deUint32 target,int level,deUint32 internalFormat,int width,int height)

{
  TextureFormat texFormat;
  TransferFormat TVar1;
  ulong uVar2;
  
  uVar2 = 0x1401;
  TVar1.dataType = 0;
  TVar1.format = internalFormat;
  if (4 < internalFormat - 0x1906) {
    texFormat = glu::mapGLInternalFormat(internalFormat);
    TVar1 = glu::getTransferFormat(texFormat);
    uVar2 = (ulong)TVar1 >> 0x20;
  }
  (*this->_vptr_Context[0x11])
            (this,(ulong)target,(ulong)(uint)level,(ulong)internalFormat,width,height,0,TVar1,uVar2,
             0);
  return;
}

Assistant:

void Context::texImage2D (deUint32 target, int level, deUint32 internalFormat, int width, int height)
{
	deUint32	format		= GL_NONE;
	deUint32	dataType	= GL_NONE;

	switch (internalFormat)
	{
		case GL_ALPHA:
		case GL_LUMINANCE:
		case GL_LUMINANCE_ALPHA:
		case GL_RGB:
		case GL_RGBA:
			format		= internalFormat;
			dataType	= GL_UNSIGNED_BYTE;
			break;

		default:
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(glu::mapGLInternalFormat(internalFormat));
			format		= transferFmt.format;
			dataType	= transferFmt.dataType;
			break;
		}
	}

	texImage2D(target, level, internalFormat, width, height, 0, format, dataType, DE_NULL);
}